

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# import_obj.c
# Opt level: O0

mesh * import_obj_model(scene *scene,char *file_name)

{
  obj_model *model_00;
  mesh *mesh;
  obj_model *model;
  char *file_name_local;
  scene *scene_local;
  
  model_00 = load_obj_model(file_name);
  if (model_00 == (obj_model *)0x0) {
    scene_local = (scene *)0x0;
  }
  else {
    scene_local = (scene *)build_mesh_from_obj_model(model_00);
    free_obj_model(model_00);
  }
  return (mesh *)scene_local;
}

Assistant:

struct mesh* import_obj_model(struct scene* scene, const char* file_name) {
    // TODO: Convert materials
    IGNORE(scene);
    struct obj_model* model = load_obj_model(file_name);
    if (!model)
        return NULL;
    struct mesh* mesh = build_mesh_from_obj_model(model);
    free_obj_model(model);
    return mesh;
}